

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

int __thiscall boost::filesystem::detail::copy(detail *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  file_status fVar1;
  file_status extraout_RAX;
  file_status extraout_RAX_00;
  file_status extraout_RAX_01;
  file_status s;
  int local_20 [2];
  
  fVar1 = symlink_status((detail *)local_20,(path *)this,(error_code *)src);
  if (*(int *)src == 0) {
    if (local_20[0] == 2) {
      copy_file((path *)this,(path *)dst,fail_if_exists,(error_code *)src);
      fVar1 = extraout_RAX_01;
    }
    else if (local_20[0] == 3) {
      copy_directory((path *)this,(path *)dst,(error_code *)src);
      fVar1 = extraout_RAX_00;
    }
    else if (local_20[0] == 4) {
      copy_symlink((path *)this,(path *)dst,(error_code *)src);
      fVar1 = extraout_RAX;
    }
    else {
      fVar1 = (file_status)system::system_category();
      *(undefined4 *)src = 0x26;
      *(file_status *)(src + 8) = fVar1;
    }
  }
  return fVar1.m_value;
}

Assistant:

BOOST_FILESYSTEM_DECL
  void copy(const path& from, const path& to, system::error_code* ec)
  {
    file_status s(symlink_status(from, *ec));
    if (ec != 0 && *ec) return;

    if(is_symlink(s))
    {
      copy_symlink(from, to, *ec);
    }
    else if(is_directory(s))
    {
      copy_directory(from, to, *ec);
    }
    else if(is_regular_file(s))
    {
      copy_file(from, to, fs::copy_option::fail_if_exists, *ec);
    }
    else
    {
      if (ec == 0)
        BOOST_FILESYSTEM_THROW(filesystem_error("boost::filesystem::copy",
          from, to, error_code(BOOST_ERROR_NOT_SUPPORTED, system_category())));
      ec->assign(BOOST_ERROR_NOT_SUPPORTED, system_category());
    }
  }